

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeDualfarkas4Row
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *direction,SPxId enterId)

{
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *this_00;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined8 uVar1;
  type_conflict5 tVar2;
  int iVar3;
  int j;
  long lVar4;
  uint uVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId spxid;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sign;
  cpp_dec_float<50U,_int,_void> local_f8;
  DataKey local_c0;
  DataKey local_b8;
  DataKey local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  DataKey local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_f8.data._M_elems._0_8_ = local_f8.data._M_elems._0_8_ & 0xffffffff00000000;
  local_c0 = enterId.super_DataKey;
  local_b0 = enterId.super_DataKey;
  tVar2 = boost::multiprecision::operator>(direction,(int *)&local_f8);
  if (tVar2) {
    uVar5 = 0xbff00000;
  }
  else {
    uVar5 = 0x3ff00000;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_a8,(double)((ulong)uVar5 << 0x20),(type *)0x0);
  (this->dualFarkas).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  this_01 = &this->dualFarkas;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(this_01,(this->theFvec->thedelta).super_IdxSet.num + 1);
  this_00 = &(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set;
  for (lVar4 = 0; lVar4 < (this->theFvec->thedelta).super_IdxSet.num; lVar4 = lVar4 + 1) {
    local_b8 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[(this->theFvec->thedelta).super_IdxSet.idx[lVar4]].super_DataKey;
    if (local_b8.info < 0) {
      SPxRowId::SPxRowId((SPxRowId *)&local_70,(SPxId *)&local_b8);
      iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              ::number(this_00,&local_70);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::value((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_68,&this->theFvec->thedelta,(int)lVar4);
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_f8,&local_a8,&local_68);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(this_01,iVar3,
            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_f8);
    }
  }
  if (local_c0.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_68,(SPxId *)&local_b0);
    iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(this_00,(DataKey *)&local_68);
    local_f8.data._M_elems[0] = local_a8.data._M_elems[0];
    local_f8.data._M_elems[1] = local_a8.data._M_elems[1];
    uVar1 = local_f8.data._M_elems._0_8_;
    local_f8.data._M_elems[2] = local_a8.data._M_elems[2];
    local_f8.data._M_elems[3] = local_a8.data._M_elems[3];
    local_f8.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
    local_f8.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
    local_f8.data._M_elems[4] = local_a8.data._M_elems[4];
    local_f8.data._M_elems[5] = local_a8.data._M_elems[5];
    local_f8.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
    local_f8.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
    local_f8.exp = local_a8.exp;
    local_f8.neg = local_a8.neg;
    local_f8.fpclass = local_a8.fpclass;
    local_f8.prec_elem = local_a8.prec_elem;
    local_f8.data._M_elems[0] = local_a8.data._M_elems[0];
    if (local_a8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0) {
      local_f8.neg = (bool)(local_a8.neg ^ 1);
    }
    local_f8.data._M_elems._0_8_ = uVar1;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(this_01,iVar3,
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_f8);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}